

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall glslang::TType::copyArraySizes(TType *this,TArraySizes *s)

{
  TArraySizes *this_00;
  TArraySizes *s_local;
  TType *this_local;
  
  this_00 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)s);
  TArraySizes::TArraySizes(this_00);
  this->arraySizes = this_00;
  TArraySizes::operator=(this->arraySizes,s);
  return;
}

Assistant:

void copyArraySizes(const TArraySizes& s)
    {
        // For setting a fresh new set of array sizes, not yet worrying about sharing.
        arraySizes = new TArraySizes;
        *arraySizes = s;
    }